

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::isFragmentShaderInterlockEnabled
          (InvocationInterlockPlacementPass *this)

{
  IRContext *pIVar1;
  bool bVar2;
  bool bVar3;
  FeatureManager *pFVar4;
  
  pIVar1 = (this->super_Pass).context_;
  pFVar4 = (pIVar1->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar4 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(pIVar1);
    pFVar4 = (pIVar1->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar2 = EnumSet<spvtools::Extension>::contains
                    (&pFVar4->extensions_,kSPV_EXT_fragment_shader_interlock);
  if (bVar2) {
    pIVar1 = (this->super_Pass).context_;
    pFVar4 = (pIVar1->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    if (pFVar4 == (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(pIVar1);
      pFVar4 = (pIVar1->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    }
    bVar3 = EnumSet<spv::Capability>::contains
                      (&pFVar4->capabilities_,CapabilityFragmentShaderSampleInterlockEXT);
    bVar2 = true;
    if (!bVar3) {
      pIVar1 = (this->super_Pass).context_;
      pFVar4 = (pIVar1->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      if (pFVar4 == (FeatureManager *)0x0) {
        IRContext::AnalyzeFeatures(pIVar1);
        pFVar4 = (pIVar1->feature_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                 .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      }
      bVar3 = EnumSet<spv::Capability>::contains
                        (&pFVar4->capabilities_,CapabilityFragmentShaderPixelInterlockEXT);
      if (!bVar3) {
        pIVar1 = (this->super_Pass).context_;
        pFVar4 = (pIVar1->feature_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                 .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
        if (pFVar4 == (FeatureManager *)0x0) {
          IRContext::AnalyzeFeatures(pIVar1);
          pFVar4 = (pIVar1->feature_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                   .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
        }
        bVar2 = EnumSet<spv::Capability>::contains
                          (&pFVar4->capabilities_,CapabilityFragmentShaderShadingRateInterlockEXT);
        return bVar2;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool InvocationInterlockPlacementPass::isFragmentShaderInterlockEnabled() {
  if (!context()->get_feature_mgr()->HasExtension(
          kSPV_EXT_fragment_shader_interlock)) {
    return false;
  }

  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::FragmentShaderSampleInterlockEXT)) {
    return true;
  }

  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::FragmentShaderPixelInterlockEXT)) {
    return true;
  }

  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::FragmentShaderShadingRateInterlockEXT)) {
    return true;
  }

  return false;
}